

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O2

int archive_read_format_iso9660_options(archive_read *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = a->format->data;
  iVar2 = strcmp(key,"joliet");
  if (iVar2 == 0) {
    if (((((val == (char *)0x0) || (iVar2 = strcmp(val,"off"), iVar2 == 0)) ||
         (iVar2 = strcmp(val,"ignore"), iVar2 == 0)) || (iVar2 = strcmp(val,"disable"), iVar2 == 0))
       || ((*val == '0' && (val[1] == '\0')))) {
      *(undefined4 *)((long)pvVar1 + 4) = 0;
    }
    else {
      *(undefined4 *)((long)pvVar1 + 4) = 1;
    }
  }
  else {
    iVar2 = strcmp(key,"rockridge");
    if ((iVar2 != 0) && (iVar2 = strcmp(key,"Rockridge"), iVar2 != 0)) {
      return -0x14;
    }
    *(uint *)((long)pvVar1 + 8) = (uint)(val != (char *)0x0);
  }
  return 0;
}

Assistant:

static int
archive_read_format_iso9660_options(struct archive_read *a,
		const char *key, const char *val)
{
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (strcmp(key, "joliet") == 0) {
		if (val == NULL || strcmp(val, "off") == 0 ||
				strcmp(val, "ignore") == 0 ||
				strcmp(val, "disable") == 0 ||
				strcmp(val, "0") == 0)
			iso9660->opt_support_joliet = 0;
		else
			iso9660->opt_support_joliet = 1;
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "rockridge") == 0 ||
	    strcmp(key, "Rockridge") == 0) {
		iso9660->opt_support_rockridge = val != NULL;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}